

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_decl.cc
# Opt level: O3

void __thiscall Decl::Decl(Decl *this,ID *id,DeclType decl_type)

{
  mapped_type *ppDVar1;
  Decl *local_30;
  
  Object::Object(&this->super_Object);
  this->_vptr_Decl = (_func_int **)&PTR__Decl_00144a68;
  this->id_ = id;
  this->decl_type_ = decl_type;
  this->attrlist_ = (AttrList *)0x0;
  ppDVar1 = std::
            map<const_ID_*,_Decl_*,_ID_ptr_cmp,_std::allocator<std::pair<const_ID_*const,_Decl_*>_>_>
            ::operator[](&decl_map_,&this->id_);
  *ppDVar1 = this;
  if (decl_list_ == (DeclList *)0x0) {
    decl_list_ = (DeclList *)operator_new(0x18);
    (decl_list_->super__Vector_base<Decl_*,_std::allocator<Decl_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (decl_list_->super__Vector_base<Decl_*,_std::allocator<Decl_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (decl_list_->super__Vector_base<Decl_*,_std::allocator<Decl_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  local_30 = this;
  std::vector<Decl*,std::allocator<Decl*>>::emplace_back<Decl*>
            ((vector<Decl*,std::allocator<Decl*>> *)decl_list_,&local_30);
  if (FLAGS_pac_debug == true) {
    Decl((Decl *)&this->id_);
  }
  this->analyzer_context_ = (AnalyzerContextDecl *)0x0;
  return;
}

Assistant:

Decl::Decl(ID* id, DeclType decl_type) : id_(id), decl_type_(decl_type), attrlist_(nullptr)
	{
	decl_map_[id_] = this;
	if ( ! decl_list_ )
		decl_list_ = new DeclList();
	decl_list_->push_back(this);

	DEBUG_MSG("Finished Decl %s\n", id_->Name());

	analyzer_context_ = nullptr;
	}